

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

bool __thiscall fmcalc::loadcoverages(fmcalc *this,vector<float,_std::allocator<float>_> *coverages)

{
  value_type vVar1;
  long lVar2;
  char *__filename;
  FILE *__stream;
  reference pvVar3;
  size_t local_d0;
  size_t i;
  int coverage_id;
  size_t nrec;
  ulong uStack_b0;
  OASIS_FLOAT tiv;
  longlong sz;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [55];
  allocator local_49;
  string local_48 [8];
  string file;
  FILE *fin;
  vector<float,_std::allocator<float>_> *coverages_local;
  fmcalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"input/coverages.bin",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_48);
    std::operator+(local_80,&this->inputpath_);
    std::__cxx11::string::operator=(local_48,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string(local_a0);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    fseek(__stream,0,2);
    uStack_b0 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize(coverages,(uStack_b0 >> 2) + 1);
    i._4_4_ = 0;
    local_d0 = fread((void *)((long)&nrec + 4),4,1,__stream);
    while (vVar1 = nrec._4_4_, local_d0 != 0) {
      i._4_4_ = i._4_4_ + 1;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](coverages,(long)i._4_4_);
      *pvVar3 = vVar1;
      local_d0 = fread((void *)((long)&nrec + 4),4,1,__stream);
    }
    fclose(__stream);
    this_local._7_1_ = true;
  }
  sz._4_4_ = 1;
  std::__cxx11::string::~string(local_48);
  return this_local._7_1_;
}

Assistant:

bool fmcalc::loadcoverages(std::vector<OASIS_FLOAT> &coverages)
{

	FILE *fin = NULL;
	std::string file = COVERAGES_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) return false;

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	size_t nrec = sz / sizeof(tiv);

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);
	return true;

}